

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve.c
# Opt level: O1

int check_instid_ext_dep(lys_node *sleaf,char *json_instid)

{
  undefined8 in_RAX;
  lys_node *node;
  lys_node *plVar1;
  char *pcVar2;
  size_t __n;
  lys_module *plVar3;
  lys_module *plVar4;
  int iVar5;
  undefined8 uStack_38;
  int_log_opts prev_ilo;
  
  iVar5 = 0;
  if ((json_instid != (char *)0x0) &&
     (node = sleaf, iVar5 = 0, uStack_38 = in_RAX, *json_instid != '\0')) {
    do {
      node = lys_parent(node);
      if (node == (lys_node *)0x0) goto LAB_0011b406;
    } while ((node->nodetype & (LYS_ACTION|LYS_RPC|LYS_NOTIF)) == LYS_UNKNOWN);
    plVar1 = lys_parent(node);
    iVar5 = 1;
    if (plVar1 == (lys_node *)0x0) {
LAB_0011b406:
      pcVar2 = strchr(json_instid + 1,0x2f);
      if (pcVar2 == (char *)0x0) {
        __n = strlen(json_instid);
      }
      else {
        __n = (long)pcVar2 - (long)json_instid;
      }
      pcVar2 = strndup(json_instid,__n);
      iVar5 = 0;
      if (pcVar2 != (char *)0x0) {
        ly_ilo_change((ly_ctx *)0x0,ILO_IGNORE,(int_log_opts *)((long)&uStack_38 + 4),
                      (ly_err_item **)0x0);
        plVar1 = ly_ctx_get_node((ly_ctx *)0x0,sleaf,pcVar2,0);
        ly_ilo_restore((ly_ctx *)0x0,uStack_38._4_4_,(ly_err_item *)0x0,0);
        free(pcVar2);
        iVar5 = 1;
        if (plVar1 != (lys_node *)0x0) {
          if (node == (lys_node *)0x0) {
            plVar3 = lys_node_module(sleaf);
            plVar4 = lys_node_module(plVar1);
            if (plVar3 != plVar4) {
              return 1;
            }
          }
          else if (node != plVar1) {
            return 1;
          }
          iVar5 = 0;
        }
      }
    }
  }
  return iVar5;
}

Assistant:

static int
check_instid_ext_dep(const struct lys_node *sleaf, const char *json_instid)
{
    const struct lys_node *op_node, *first_node;
    enum int_log_opts prev_ilo;
    char *buf, *tmp;

    if (!json_instid || !json_instid[0]) {
        /* no/empty value */
        return 0;
    }

    for (op_node = lys_parent(sleaf);
         op_node && !(op_node->nodetype & (LYS_NOTIF | LYS_RPC | LYS_ACTION));
         op_node = lys_parent(op_node));

    if (op_node && lys_parent(op_node)) {
        /* nested operation - any absolute path is external */
        return 1;
    }

    /* get the first node from the instid */
    tmp = strchr(json_instid + 1, '/');
    buf = strndup(json_instid, tmp ? (size_t)(tmp - json_instid) : strlen(json_instid));
    if (!buf) {
        /* so that we do not have to bother with logging, say it is not external */
        return 0;
    }

    /* find the first schema node, do not log */
    ly_ilo_change(NULL, ILO_IGNORE, &prev_ilo, NULL);
    first_node = ly_ctx_get_node(NULL, sleaf, buf, 0);
    ly_ilo_restore(NULL, prev_ilo, NULL, 0);

    free(buf);
    if (!first_node) {
        /* unknown path, say it is external */
        return 1;
    }

    /* based on the first schema node in the path we can decide whether it points to an external tree or not */

    if (op_node) {
        if (op_node != first_node) {
            /* it is a top-level operation, so we're good if it points somewhere inside it */
            return 1;
        }
    } else {
        if (lys_node_module(sleaf) != lys_node_module(first_node)) {
            /* modules differ */
            return 1;
        }
    }

    return 0;
}